

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O0

void __thiscall tripwire_indexed_Test::TestBody(tripwire_indexed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  TripWireTrigger trig;
  Message local_f0 [2];
  out_of_range *anon_var_0;
  type e;
  TripWireDetector local_b0;
  byte local_99;
  undefined1 auStack_98 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  TripWireDetector detect;
  tripwire_indexed_Test *this_local;
  
  gmlc::concurrency::TripWireDetector::TripWireDetector((TripWireDetector *)&gtest_ar_.message_,5);
  local_31 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)&gtest_ar_.message_)
  ;
  local_31 = !local_31;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&gtest_msg.value.field_2 + 8),(internal *)local_30,
               (AssertionResult *)"detect.isTripped()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)(gtest_msg.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_98[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff69 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_98);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_98);
  if (bVar1) {
    local_99 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gmlc::concurrency::TripWireDetector::TripWireDetector(&local_b0,0xc);
      gmlc::concurrency::TripWireDetector::~TripWireDetector(&local_b0);
    }
    if ((local_99 & 1) != 0) goto LAB_0012781c;
    std::__cxx11::string::operator=
              ((string *)auStack_98,
               "Expected: TripWireDetector(12) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             &trig.lineTrigger.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
             ,0x29,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             &trig.lineTrigger.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_f0);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &trig.lineTrigger.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::Message::~Message(local_f0);
LAB_0012781c:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_98);
  gmlc::concurrency::TripWireTrigger::TripWireTrigger((TripWireTrigger *)&gtest_ar__1.message_,5);
  local_119 = gmlc::concurrency::TripWireDetector::isTripped
                        ((TripWireDetector *)&gtest_ar_.message_);
  local_119 = !local_119;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_118,
               (AssertionResult *)"detect.isTripped()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  gmlc::concurrency::TripWireTrigger::~TripWireTrigger((TripWireTrigger *)&gtest_ar__1.message_);
  local_161 = gmlc::concurrency::TripWireDetector::isTripped
                        ((TripWireDetector *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_160,(AssertionResult *)"detect.isTripped()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  gmlc::concurrency::TripWireDetector::~TripWireDetector((TripWireDetector *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(tripwire, indexed)
{
    TripWireDetector detect(5);

    EXPECT_FALSE(detect.isTripped());

    EXPECT_THROW(TripWireDetector(12), std::out_of_range);
    // smaller scope for trigger
    {
        TripWireTrigger trig(5);
        EXPECT_FALSE(detect.isTripped());
    }
    EXPECT_TRUE(detect.isTripped());
}